

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset.c
# Opt level: O2

void * memset(void *__s,int __c,size_t __n)

{
  size_t sVar1;
  uchar *p;
  
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    *(char *)((long)__s + sVar1) = (char)__c;
  }
  return __s;
}

Assistant:

void * memset( void * s, int c, size_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return s;
}